

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Track::GetNext(Track *this,BlockEntry *pCurrEntry,BlockEntry **pNextEntry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  longlong lVar3;
  Cluster *this_01;
  Block *this_02;
  BlockEntry *pBVar4;
  long *in_RDX;
  BlockEntry *in_RSI;
  Track *in_RDI;
  Block *pNextBlock;
  int i;
  long status;
  Cluster *pCluster;
  Block *pCurrBlock;
  Cluster *in_stack_00000090;
  Segment *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffc0;
  BlockEntry **in_stack_ffffffffffffffc8;
  Segment *local_8;
  Cluster *this_00;
  
  iVar2 = (*in_RSI->_vptr_BlockEntry[2])();
  this_00 = (Cluster *)CONCAT44(extraout_var,iVar2);
  if ((this_00 == (Cluster *)0x0) ||
     (lVar3 = Block::GetTrackNumber((Block *)this_00), lVar3 != (in_RDI->m_info).number)) {
    local_8 = (Segment *)0xffffffffffffffff;
  }
  else {
    this_01 = BlockEntry::GetCluster(in_RSI);
    local_8 = (Segment *)Cluster::GetNext(this_00,(BlockEntry *)this_01,in_stack_ffffffffffffffc8);
    if (-1 < (long)local_8) {
      iVar2 = 0;
      do {
        while (*in_RDX == 0) {
          this_01 = Segment::GetNext(in_stack_00000098,in_stack_00000090);
          if (this_01 == (Cluster *)0x0) {
            pBVar4 = GetEOS(in_RDI);
            *in_RDX = (long)pBVar4;
            return 1;
          }
          bVar1 = Cluster::EOS(this_01);
          if (bVar1) {
            bVar1 = Segment::DoneParsing(local_8);
            if (!bVar1) {
              *in_RDX = 0;
              return -3;
            }
            pBVar4 = GetEOS(in_RDI);
            *in_RDX = (long)pBVar4;
            return 1;
          }
          local_8 = (Segment *)
                    Cluster::GetFirst((Cluster *)local_8,
                                      (BlockEntry **)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
          if ((long)local_8 < 0) {
            return (long)local_8;
          }
          if ((*in_RDX != 0) && (iVar2 = iVar2 + 1, 99 < iVar2)) {
            pBVar4 = GetEOS(in_RDI);
            *in_RDX = (long)pBVar4;
            return 1;
          }
        }
        this_02 = (Block *)(**(code **)(*(long *)*in_RDX + 0x10))();
        lVar3 = Block::GetTrackNumber(this_02);
        if (lVar3 == (in_RDI->m_info).number) {
          return 0;
        }
        local_8 = (Segment *)Cluster::GetNext(this_00,(BlockEntry *)this_01,(BlockEntry **)local_8);
      } while (-1 < (long)local_8);
    }
  }
  return (long)local_8;
}

Assistant:

long Track::GetNext(const BlockEntry* pCurrEntry,
                    const BlockEntry*& pNextEntry) const {
  assert(pCurrEntry);
  assert(!pCurrEntry->EOS());  //?

  const Block* const pCurrBlock = pCurrEntry->GetBlock();
  assert(pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number);
  if (!pCurrBlock || pCurrBlock->GetTrackNumber() != m_info.number)
    return -1;

  const Cluster* pCluster = pCurrEntry->GetCluster();
  assert(pCluster);
  assert(!pCluster->EOS());

  long status = pCluster->GetNext(pCurrEntry, pNextEntry);

  if (status < 0)  // error
    return status;

  for (int i = 0;;) {
    while (pNextEntry) {
      const Block* const pNextBlock = pNextEntry->GetBlock();
      assert(pNextBlock);

      if (pNextBlock->GetTrackNumber() == m_info.number)
        return 0;

      pCurrEntry = pNextEntry;

      status = pCluster->GetNext(pCurrEntry, pNextEntry);

      if (status < 0)  // error
        return status;
    }

    pCluster = m_pSegment->GetNext(pCluster);

    if (pCluster == NULL) {
      pNextEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pNextEntry = GetEOS();
        return 1;
      }

      // TODO: there is a potential O(n^2) problem here: we tell the
      // caller to (pre)load another cluster, which he does, but then he
      // calls GetNext again, which repeats the same search.  This is
      // a pathological case, since the only way it can happen is if
      // there exists a long sequence of clusters none of which contain a
      // block from this track.  One way around this problem is for the
      // caller to be smarter when he loads another cluster: don't call
      // us back until you have a cluster that contains a block from this
      // track. (Of course, that's not cheap either, since our caller
      // would have to scan the each cluster as it's loaded, so that
      // would just push back the problem.)

      pNextEntry = NULL;
      return E_BUFFER_NOT_FULL;
    }

    status = pCluster->GetFirst(pNextEntry);

    if (status < 0)  // error
      return status;

    if (pNextEntry == NULL)  // empty cluster
      continue;

    ++i;

    if (i >= 100)
      break;
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number after lots of searching, so we give
  // up trying.

  pNextEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}